

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

bool __thiscall SQClass::SetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  long *plVar1;
  uint uVar2;
  SQObjectType SVar3;
  long *plVar4;
  bool bVar5;
  ulong uVar6;
  SQClassMember *pSVar7;
  SQObjectPtr idx;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  bVar5 = SQTable::Get(this->_members,key,&local_28);
  if (bVar5) {
    if ((local_28.super_SQObject._unVal._0_4_ >> 0x19 & 1) == 0) {
      pSVar7 = (this->_methods)._vals;
    }
    else {
      pSVar7 = (this->_defaultvalues)._vals;
    }
    uVar6 = (ulong)((local_28.super_SQObject._unVal._0_4_ & 0xffffff) << 5);
    uVar2 = *(uint *)((long)&(pSVar7->attrs).super_SQObject._type + uVar6);
    plVar4 = *(long **)((long)&(pSVar7->attrs).super_SQObject._unVal + uVar6);
    *(SQObjectValue *)((long)&(pSVar7->attrs).super_SQObject._unVal + uVar6) =
         (val->super_SQObject)._unVal;
    SVar3 = (val->super_SQObject)._type;
    *(SQObjectType *)((long)&(pSVar7->attrs).super_SQObject._type + uVar6) = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      plVar1 = (long *)(*(long *)((long)&(pSVar7->attrs).super_SQObject._unVal + uVar6) + 8);
      *plVar1 = *plVar1 + 1;
    }
    if ((uVar2 >> 0x1b & 1) != 0) {
      plVar1 = plVar4 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*plVar4 + 0x10))();
      }
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar5;
}

Assistant:

bool SQClass::SetAttributes(const SQObjectPtr &key,const SQObjectPtr &val)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        if(_isfield(idx))
            _defaultvalues[_member_idx(idx)].attrs = val;
        else
            _methods[_member_idx(idx)].attrs = val;
        return true;
    }
    return false;
}